

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,void *defaultValue,
          ByteCount defaultSize)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  uint defaultSize_00;
  ThrowOverflow local_1d;
  ByteCount local_1c;
  void *pvStack_18;
  ByteCount defaultSize_local;
  void *defaultValue_local;
  PointerBuilder *this_local;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  local_1c = defaultSize;
  pvStack_18 = defaultValue;
  defaultValue_local = this;
  defaultSize_00 = assertMax<536870910u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_1d);
  WireHelpers::getWritableTextPointer
            (__return_storage_ptr__,ref,segment,capTable,defaultValue,defaultSize_00);
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableTextPointer(pointer, segment, capTable, defaultValue,
      assertMax<MAX_TEXT_SIZE>(defaultSize, ThrowOverflow()));
}